

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateRawAccessChain(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint uVar4;
  char *__s;
  DiagnosticStream *pDVar5;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar6;
  DiagnosticStream local_1048;
  DiagnosticStream local_e70;
  DiagnosticStream local_c98;
  uint64_t local_ac0;
  uint64_t stride_value;
  uint32_t access_operands;
  spv_result_t result;
  anon_class_24_3_e757d3e0 ValidateType;
  char *local_a90;
  string local_a88;
  DiagnosticStream local_a68;
  Instruction *local_890;
  Instruction *stride_type;
  char *local_880;
  string local_878;
  DiagnosticStream local_858;
  Instruction *local_680;
  Instruction *stride;
  DiagnosticStream local_658;
  Instruction *local_480;
  Instruction *result_type_pointee;
  DiagnosticStream local_458;
  StorageClass local_27c;
  undefined4 local_278;
  StorageClass storage_class;
  char *local_270;
  string local_268;
  DiagnosticStream local_248;
  Instruction *local_70;
  Instruction *result_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string instr_name;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  instr_name.field_2._8_8_ = inst;
  OVar2 = val::Instruction::opcode((Instruction *)inst);
  __s = spvOpcodeString(OVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,__s,(allocator<char> *)((long)&result_type + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"Op",
                 &local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result_type + 7));
  uVar3 = val::Instruction::type_id((Instruction *)instr_name.field_2._8_8_);
  local_70 = ValidationState_t::FindDef(_,uVar3);
  OVar2 = val::Instruction::opcode(local_70);
  if (OVar2 == OpTypePointer) {
    local_27c = val::Instruction::GetOperandAs<spv::StorageClass>(local_70,1);
    if (((local_27c == StorageBuffer) || (local_27c == PhysicalStorageBuffer)) ||
       (local_27c == StorageClassUniform)) {
      uVar4 = val::Instruction::GetOperandAs<unsigned_int>(local_70,2);
      local_480 = ValidationState_t::FindDef(_,uVar4);
      OVar2 = val::Instruction::opcode(local_480);
      if (((OVar2 == OpTypeArray) ||
          (OVar2 = val::Instruction::opcode(local_480), OVar2 == OpTypeMatrix)) ||
         (OVar2 = val::Instruction::opcode(local_480), OVar2 == OpTypeStruct)) {
        ValidationState_t::diag
                  (&local_658,_,SPV_ERROR_INVALID_DATA,(Instruction *)instr_name.field_2._8_8_);
        pDVar5 = DiagnosticStream::operator<<(&local_658,(char (*) [20])"The Result Type of ");
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0xd2734c);
        uVar3 = val::Instruction::id((Instruction *)instr_name.field_2._8_8_);
        ValidationState_t::getIdName_abi_cxx11_((string *)&stride,_,uVar3);
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&stride);
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(char (*) [63])
                                   " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.")
        ;
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        std::__cxx11::string::~string((string *)&stride);
        DiagnosticStream::~DiagnosticStream(&local_658);
      }
      else {
        uVar4 = val::Instruction::GetOperandAs<unsigned_int>
                          ((Instruction *)instr_name.field_2._8_8_,3);
        local_680 = ValidationState_t::FindDef(_,uVar4);
        OVar2 = val::Instruction::opcode(local_680);
        if (OVar2 == OpConstant) {
          uVar3 = val::Instruction::type_id(local_680);
          local_890 = ValidationState_t::FindDef(_,uVar3);
          OVar2 = val::Instruction::opcode(local_890);
          if (OVar2 == OpTypeInt) {
            ValidateType._ = (ValidationState_t *)((long)&instr_name.field_2 + 8);
            ValidateType.inst = (Instruction **)local_40;
            _access_operands = _;
            stride_value._4_4_ =
                 ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                           ((anon_class_24_3_e757d3e0 *)&access_operands,"Index",4);
            __local._4_4_ = stride_value._4_4_;
            if ((stride_value._4_4_ == SPV_SUCCESS) &&
               (stride_value._4_4_ =
                     ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                               ((anon_class_24_3_e757d3e0 *)&access_operands,"Offset",5),
               __local._4_4_ = stride_value._4_4_, stride_value._4_4_ == SPV_SUCCESS)) {
              stride_value._0_4_ = 0;
              this = val::Instruction::operands((Instruction *)instr_name.field_2._8_8_);
              sVar6 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                                (this);
              if (6 < sVar6) {
                stride_value._0_4_ =
                     val::Instruction::GetOperandAs<unsigned_int>
                               ((Instruction *)instr_name.field_2._8_8_,6);
              }
              if (((uint)stride_value & 2) != 0) {
                local_ac0 = 0;
                uVar3 = val::Instruction::id(local_680);
                bVar1 = ValidationState_t::EvalConstantValUint64(_,uVar3,&local_ac0);
                if ((bVar1) && (local_ac0 == 0)) {
                  ValidationState_t::diag
                            (&local_c98,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)instr_name.field_2._8_8_);
                  pDVar5 = DiagnosticStream::operator<<
                                     (&local_c98,
                                      (char (*) [61])
                                      "Stride must not be zero when per-element robustness is used."
                                     );
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                  DiagnosticStream::~DiagnosticStream(&local_c98);
                  goto LAB_00bb27aa;
                }
              }
              if (((((uint)stride_value & 1) == 0) && (((uint)stride_value & 2) == 0)) ||
                 (local_27c != PhysicalStorageBuffer)) {
                if ((((uint)stride_value & 1) == 0) || (((uint)stride_value & 2) == 0)) {
                  __local._4_4_ = SPV_SUCCESS;
                }
                else {
                  ValidationState_t::diag
                            (&local_1048,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)instr_name.field_2._8_8_);
                  pDVar5 = DiagnosticStream::operator<<
                                     (&local_1048,
                                      (char (*) [76])
                                      "Per-component robustness and per-element robustness are mutually exclusive."
                                     );
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                  DiagnosticStream::~DiagnosticStream(&local_1048);
                }
              }
              else {
                ValidationState_t::diag
                          (&local_e70,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)instr_name.field_2._8_8_);
                pDVar5 = DiagnosticStream::operator<<
                                   (&local_e70,
                                    (char (*) [88])
                                    "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
                                   );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                DiagnosticStream::~DiagnosticStream(&local_e70);
              }
            }
          }
          else {
            ValidationState_t::diag
                      (&local_a68,_,SPV_ERROR_INVALID_DATA,(Instruction *)instr_name.field_2._8_8_);
            pDVar5 = DiagnosticStream::operator<<
                               (&local_a68,(char (*) [23])"The type of Stride of ");
            pDVar5 = DiagnosticStream::operator<<
                               (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_40);
            pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0xd2734c);
            uVar3 = val::Instruction::id((Instruction *)instr_name.field_2._8_8_);
            ValidationState_t::getIdName_abi_cxx11_(&local_a88,_,uVar3);
            pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_a88);
            pDVar5 = DiagnosticStream::operator<<
                               (pDVar5,(char (*) [29])" must be OpTypeInt. Found Op");
            OVar2 = val::Instruction::opcode(local_890);
            local_a90 = spvOpcodeString(OVar2);
            pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_a90);
            ValidateType.instr_name._7_1_ = 0x2e;
            pDVar5 = DiagnosticStream::operator<<
                               (pDVar5,(char *)((long)&ValidateType.instr_name + 7));
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
            std::__cxx11::string::~string((string *)&local_a88);
            DiagnosticStream::~DiagnosticStream(&local_a68);
          }
        }
        else {
          ValidationState_t::diag
                    (&local_858,_,SPV_ERROR_INVALID_DATA,(Instruction *)instr_name.field_2._8_8_);
          pDVar5 = DiagnosticStream::operator<<(&local_858,(char (*) [15])"The Stride of ");
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0xd2734c);
          uVar3 = val::Instruction::id((Instruction *)instr_name.field_2._8_8_);
          ValidationState_t::getIdName_abi_cxx11_(&local_878,_,uVar3);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_878);
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(char (*) [30])" must be OpConstant. Found Op");
          OVar2 = val::Instruction::opcode(local_680);
          local_880 = spvOpcodeString(OVar2);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_880);
          stride_type._7_1_ = 0x2e;
          pDVar5 = DiagnosticStream::operator<<(pDVar5,(char *)((long)&stride_type + 7));
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          std::__cxx11::string::~string((string *)&local_878);
          DiagnosticStream::~DiagnosticStream(&local_858);
        }
      }
    }
    else {
      ValidationState_t::diag
                (&local_458,_,SPV_ERROR_INVALID_DATA,(Instruction *)instr_name.field_2._8_8_);
      pDVar5 = DiagnosticStream::operator<<(&local_458,(char (*) [20])"The Result Type of ");
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0xd2734c);
      uVar3 = val::Instruction::id((Instruction *)instr_name.field_2._8_8_);
      ValidationState_t::getIdName_abi_cxx11_((string *)&result_type_pointee,_,uVar3);
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&result_type_pointee);
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(char (*) [84])
                                 " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform."
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      std::__cxx11::string::~string((string *)&result_type_pointee);
      DiagnosticStream::~DiagnosticStream(&local_458);
    }
  }
  else {
    ValidationState_t::diag
              (&local_248,_,SPV_ERROR_INVALID_DATA,(Instruction *)instr_name.field_2._8_8_);
    pDVar5 = DiagnosticStream::operator<<(&local_248,(char (*) [20])"The Result Type of ");
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0xd2734c);
    uVar3 = val::Instruction::id((Instruction *)instr_name.field_2._8_8_);
    ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar3);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_268);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [33])" must be OpTypePointer. Found Op");
    OVar2 = val::Instruction::opcode(local_70);
    local_270 = spvOpcodeString(OVar2);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_270);
    storage_class._3_1_ = 0x2e;
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char *)((long)&storage_class + 3));
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    std::__cxx11::string::~string((string *)&local_268);
    DiagnosticStream::~DiagnosticStream(&local_248);
  }
LAB_00bb27aa:
  local_278 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateRawAccessChain(ValidationState_t& _,
                                    const Instruction* inst) {
  std::string instr_name = "Op" + std::string(spvOpcodeString(inst->opcode()));

  // The result type must be OpTypePointer.
  const auto result_type = _.FindDef(inst->type_id());
  if (spv::Op::OpTypePointer != result_type->opcode()) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The Result Type of " << instr_name << " <id> "
           << _.getIdName(inst->id()) << " must be OpTypePointer. Found Op"
           << spvOpcodeString(result_type->opcode()) << '.';
  }

  // The pointed storage class must be valid.
  const auto storage_class = result_type->GetOperandAs<spv::StorageClass>(1);
  if (storage_class != spv::StorageClass::StorageBuffer &&
      storage_class != spv::StorageClass::PhysicalStorageBuffer &&
      storage_class != spv::StorageClass::Uniform) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The Result Type of " << instr_name << " <id> "
           << _.getIdName(inst->id())
           << " must point to a storage class of "
              "StorageBuffer, PhysicalStorageBuffer, or Uniform.";
  }

  // The pointed type must not be one in the list below.
  const auto result_type_pointee =
      _.FindDef(result_type->GetOperandAs<uint32_t>(2));
  if (result_type_pointee->opcode() == spv::Op::OpTypeArray ||
      result_type_pointee->opcode() == spv::Op::OpTypeMatrix ||
      result_type_pointee->opcode() == spv::Op::OpTypeStruct) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The Result Type of " << instr_name << " <id> "
           << _.getIdName(inst->id())
           << " must not point to "
              "OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
  }

  // Validate Stride is a OpConstant.
  const auto stride = _.FindDef(inst->GetOperandAs<uint32_t>(3));
  if (stride->opcode() != spv::Op::OpConstant) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The Stride of " << instr_name << " <id> "
           << _.getIdName(inst->id()) << " must be OpConstant. Found Op"
           << spvOpcodeString(stride->opcode()) << '.';
  }
  // Stride type must be OpTypeInt
  const auto stride_type = _.FindDef(stride->type_id());
  if (stride_type->opcode() != spv::Op::OpTypeInt) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The type of Stride of " << instr_name << " <id> "
           << _.getIdName(inst->id()) << " must be OpTypeInt. Found Op"
           << spvOpcodeString(stride_type->opcode()) << '.';
  }

  // Index and Offset type must be OpTypeInt with a width of 32
  const auto ValidateType = [&](const char* name,
                                int operandIndex) -> spv_result_t {
    const auto value = _.FindDef(inst->GetOperandAs<uint32_t>(operandIndex));
    const auto value_type = _.FindDef(value->type_id());
    if (value_type->opcode() != spv::Op::OpTypeInt) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "The type of " << name << " of " << instr_name << " <id> "
             << _.getIdName(inst->id()) << " must be OpTypeInt. Found Op"
             << spvOpcodeString(value_type->opcode()) << '.';
    }
    const auto width = value_type->GetOperandAs<uint32_t>(1);
    if (width != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "The integer width of " << name << " of " << instr_name
             << " <id> " << _.getIdName(inst->id()) << " must be 32. Found "
             << width << '.';
    }
    return SPV_SUCCESS;
  };
  spv_result_t result;
  result = ValidateType("Index", 4);
  if (result != SPV_SUCCESS) {
    return result;
  }
  result = ValidateType("Offset", 5);
  if (result != SPV_SUCCESS) {
    return result;
  }

  uint32_t access_operands = 0;
  if (inst->operands().size() >= 7) {
    access_operands = inst->GetOperandAs<uint32_t>(6);
  }
  if (access_operands &
      uint32_t(spv::RawAccessChainOperandsMask::RobustnessPerElementNV)) {
    uint64_t stride_value = 0;
    if (_.EvalConstantValUint64(stride->id(), &stride_value) &&
        stride_value == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Stride must not be zero when per-element robustness is used.";
    }
  }
  if (access_operands &
          uint32_t(spv::RawAccessChainOperandsMask::RobustnessPerComponentNV) ||
      access_operands &
          uint32_t(spv::RawAccessChainOperandsMask::RobustnessPerElementNV)) {
    if (storage_class == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Storage class cannot be PhysicalStorageBuffer when "
                "raw access chain robustness is used.";
    }
  }
  if (access_operands &
          uint32_t(spv::RawAccessChainOperandsMask::RobustnessPerComponentNV) &&
      access_operands &
          uint32_t(spv::RawAccessChainOperandsMask::RobustnessPerElementNV)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Per-component robustness and per-element robustness are "
              "mutually exclusive.";
  }

  return SPV_SUCCESS;
}